

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::FloatVector::MergePartialFromCodedStream
          (FloatVector *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint tag;
  ulong uVar5;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001823fc;
      input->buffer_ = pbVar2 + 1;
      uVar5 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001823fc:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar5 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar5 = 0x100000000;
      }
      uVar5 = uVar4 | uVar5;
    }
    tag = (uint)uVar5;
    if ((tag & 0xfffffff8) == 8 && (uVar5 & 0x100000000) != 0) {
      if (tag == 0xd) {
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (1,10,input,&this->vector_);
      }
      else {
        if (tag != 10) goto LAB_00182444;
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (input,&this->vector_);
      }
    }
    else {
LAB_00182444:
      if (tag == 0) {
        return true;
      }
      if ((tag & 7) == 4) {
        return true;
      }
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
    }
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool FloatVector::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.FloatVector)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated float vector = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, this->mutable_vector())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(13u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 1, 10u, input, this->mutable_vector())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.FloatVector)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.FloatVector)
  return false;
#undef DO_
}